

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::IsWritable
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  uint uVar6;
  int local_3c;
  PropertyRecord *pPStack_38;
  int i;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x4c5,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00d9adf9;
    *puVar5 = 0;
  }
  pPStack_38 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&stack0xffffffffffffffc8,
                     (DictionaryPropertyDescriptor<int> **)&propertyRecord,&local_3c);
  if (bVar3) {
    bVar4 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1);
    if (((bVar4 & 0x10) == 0) ||
       (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 2) != 0)) {
      uVar6 = bVar4 & 4;
    }
    else {
      if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
          TypeIds_GlobalObject) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x4cb,"(VarIs<RootObjectBase>(instance))",
                                    "object must be a global object if letconstglobal is set");
        if (!bVar3) {
LAB_00d9adf9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        bVar4 = *(byte *)((long)&(propertyRecord->super_FinalizableObject).
                                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
      }
      uVar6 = (uint)(-1 < (char)bVar4);
    }
  }
  else {
    uVar6 = 1;
    if (pPStack_38->isNumeric == true) {
      bVar3 = DynamicObject::HasObjectArray(instance);
      plVar1 = *(long **)&(instance->field_1).field_1;
      if (plVar1 != (long *)0x0 && bVar3) {
        uVar6 = (**(code **)(*plVar1 + 0x180))(plVar1,propertyId);
      }
    }
  }
  return uVar6;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsWritable(DynamicObject* instance, PropertyId propertyId)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (!descriptor->HasNonLetConstGlobal())
            {
                AssertMsg(VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
                return !(descriptor->Attributes & PropertyConst);
            }
            return descriptor->Attributes & PropertyWritable;
        }

        // Check numeric propertyRecord only if objectArray available
        if (propertyRecord->IsNumeric())
        {
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray != nullptr)
            {
                return objectArray->IsWritable(propertyId);
            }
        }

        return true;
    }